

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbox2d.cpp
# Opt level: O2

void masc::polygon::saveSVG(string *svg_filename,c_ply *ply,obb *box)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Point2d *pPVar4;
  ostream *poVar5;
  float fVar6;
  double dVar7;
  Fill local_1c0;
  Document local_1a0;
  Polygon local_130;
  undefined1 local_b0 [40];
  undefined **local_88;
  double local_80;
  undefined **local_78;
  bool local_70;
  undefined8 local_6c;
  int local_64;
  pointer local_60;
  pointer pPStack_58;
  pointer local_50;
  _List_node_base local_48;
  size_t local_38;
  
  fVar6 = c_ply::getRadius(ply);
  pPVar4 = c_ply::getCenter(ply);
  dVar1 = (double)fVar6 * 2.5;
  dVar2 = pPVar4->v[0];
  dVar3 = pPVar4->v[1];
  dVar7 = (double)fVar6 * 1.25;
  std::__cxx11::string::string((string *)&local_1a0,(string *)svg_filename);
  local_1a0.layout.scale = 1.0;
  local_1a0.layout.origin = BottomLeft;
  local_1a0.body_nodes_str._M_dataplus._M_p = (pointer)&local_1a0.body_nodes_str.field_2;
  local_1a0.body_nodes_str._M_string_length = 0;
  local_1a0.body_nodes_str.field_2._M_local_buf[0] = '\0';
  local_1a0.layout.dimensions.width = dVar1;
  local_1a0.layout.dimensions.height = dVar1;
  local_1a0.layout.origin_offset.x = dVar7 - dVar2;
  local_1a0.layout.origin_offset.y = dVar7 - dVar3;
  svg::Fill::Fill((Fill *)&local_130,Yellow);
  local_48._M_next = &local_48;
  local_b0._8_8_ = &PTR__Fill_00112c90;
  local_b0._16_8_ = &PTR__Serializeable_00112ce0;
  local_b0._24_8_ = local_130.super_Shape.fill.color.super_Serializeable._vptr_Serializeable;
  local_b0[0x20] = local_130.super_Shape.fill.color.transparent;
  local_b0._33_3_ = local_130.super_Shape.fill.color._9_3_;
  local_b0._36_4_ = local_130.super_Shape.fill.color.red;
  local_88 = &PTR__Stroke_00112d20;
  local_80 = 0.5;
  local_78 = &PTR__Serializeable_00112ce0;
  local_70 = false;
  local_6c._0_4_ = 0;
  local_6c._4_4_ = 0;
  local_64 = 0;
  local_b0._0_8_ = &PTR__Polygon_00112d60;
  local_60 = (pointer)0x0;
  pPStack_58 = (pointer)0x0;
  local_50 = (pointer)0x0;
  local_38 = 0;
  local_48._M_prev = local_48._M_next;
  box2ply(box,(Polygon *)local_b0);
  svg::Document::operator<<(&local_1a0,(Shape *)local_b0);
  svg::Fill::Fill(&local_1c0,Silver);
  local_130.boundaries.
  super__List_base<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_130.boundaries;
  local_130.super_Shape.fill.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Fill_00112c90;
  local_130.super_Shape.fill.color.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Serializeable_00112ce0;
  local_130.super_Shape.fill.color.transparent = local_1c0.color.transparent;
  local_130.super_Shape.fill.color._9_3_ = local_1c0.color._9_3_;
  local_130.super_Shape.fill.color.red = local_1c0.color.red;
  local_130.super_Shape.fill.color.green = local_1c0.color.green;
  local_130.super_Shape.fill.color.blue = local_1c0.color.blue;
  local_130.super_Shape.stroke.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Stroke_00112d20;
  local_130.super_Shape.stroke.width = 0.5;
  local_130.super_Shape.stroke.color.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Serializeable_00112ce0;
  local_130.super_Shape.stroke.color.transparent = false;
  local_130.super_Shape.stroke.color.red = 0;
  local_130.super_Shape.stroke.color.green = 0;
  local_130.super_Shape.stroke.color.blue = 0;
  local_130.super_Shape.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Polygon_00112d60;
  local_130.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_130.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_130.boundaries.
  super__List_base<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_130.boundaries.
  super__List_base<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_130.boundaries.
       super__List_base<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  ply2ply(ply,&local_130);
  svg::Document::operator<<(&local_1a0,&local_130.super_Shape);
  svg::Document::save(&local_1a0);
  poVar5 = std::operator<<((ostream *)&std::cout,"- Saved ");
  poVar5 = std::operator<<(poVar5,(string *)svg_filename);
  std::endl<char,std::char_traits<char>>(poVar5);
  svg::Polygon::~Polygon(&local_130);
  svg::Polygon::~Polygon((Polygon *)local_b0);
  svg::Document::~Document(&local_1a0);
  return;
}

Assistant:

void saveSVG(string svg_filename, masc::polygon::c_ply& ply, const masc::polygon::obb& box)
{
  //cout<<"??"<<endl;
    //create a svg file
    //char svg_filename[256];
    //sprintf(svg_filename, "%s.svg", img_name.c_str());
    auto R=ply.getRadius();
    auto center=ply.getCenter();

    //cout<<"??"<<endl;
    svg::Dimensions dimensions(R*2.5, R*2.5);
    svg::Document doc(svg_filename, svg::Layout(dimensions, svg::Layout::BottomLeft, 1, svg::Point(-center[0]+R*1.25, -center[1]+R*1.25)));

    //------------------------------------------------------------------
    //draw the external boundary
    ///cout<<"boundary"<<endl;
    svg::Polygon box_bd(svg::Fill(svg::Color::Yellow), svg::Stroke(0.5, svg::Color::Black));
    box2ply(box, box_bd);
    doc << box_bd;

//cout<<"poly"<<endl;
    svg::Polygon poly_bd(svg::Fill(svg::Color::Silver), svg::Stroke(0.5, svg::Color::Black));
    ply2ply(ply, poly_bd);
    doc << poly_bd;

    doc.save();
    cout << "- Saved " << svg_filename << endl;
}